

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_buildCTable(void *dst,size_t dstCapacity,FSE_CTable *nextCTable,U32 FSELog,
                       symbolEncodingType_e type,uint *count,U32 max,BYTE *codeTable,size_t nbSeq,
                       S16 *defaultNorm,U32 defaultNormLog,U32 defaultMax,FSE_CTable *prevCTable,
                       size_t prevCTableSize,void *entropyWorkspace,size_t entropyWorkspaceSize)

{
  uint tableLog;
  size_t err_code;
  size_t sVar1;
  size_t sVar2;
  void *ptr;
  short asStack_a8 [60];
  
  switch(type) {
  case set_basic:
    sVar2 = FSE_buildCTable_wksp
                      (nextCTable,defaultNorm,defaultMax,defaultNormLog,entropyWorkspace,
                       entropyWorkspaceSize);
    sVar1 = 0;
    if (0xffffffffffffff88 < sVar2) {
      sVar1 = sVar2;
    }
    break;
  case set_rle:
    *(undefined2 *)nextCTable = 0;
    *(short *)((long)nextCTable + 2) = (short)(max & 0xff);
    nextCTable[1] = 0;
    (nextCTable + (ulong)(max & 0xff) * 2 + 2)[0] = 0;
    (nextCTable + (ulong)(max & 0xff) * 2 + 2)[1] = 0;
    if (dstCapacity == 0) {
      sVar1 = 0xffffffffffffffba;
    }
    else {
      *(BYTE *)dst = *codeTable;
      sVar1 = 1;
    }
    break;
  case set_compressed:
    tableLog = FSE_optimalTableLog_internal(FSELog,nbSeq,max,2);
    if (1 < count[codeTable[nbSeq - 1]]) {
      count[codeTable[nbSeq - 1]] = count[codeTable[nbSeq - 1]] - 1;
      nbSeq = nbSeq - 1;
    }
    if (nbSeq < 2) {
      __assert_fail("nbSeq_1 > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x249f,
                    "size_t ZSTD_buildCTable(void *, size_t, FSE_CTable *, U32, symbolEncodingType_e, unsigned int *, U32, const BYTE *, size_t, const S16 *, U32, U32, const FSE_CTable *, size_t, void *, size_t)"
                   );
    }
    sVar1 = FSE_normalizeCount(asStack_a8,tableLog,count,nbSeq,max);
    if (((sVar1 < 0xffffffffffffff89) &&
        (sVar1 = FSE_writeNCount(dst,dstCapacity,asStack_a8,max,tableLog),
        sVar1 < 0xffffffffffffff89)) &&
       (sVar2 = FSE_buildCTable_wksp
                          (nextCTable,asStack_a8,max,tableLog,entropyWorkspace,entropyWorkspaceSize)
       , 0xffffffffffffff88 < sVar2)) {
      sVar1 = sVar2;
    }
    break;
  case set_repeat:
    memcpy(nextCTable,prevCTable,prevCTableSize);
    sVar1 = 0;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x24a7,
                  "size_t ZSTD_buildCTable(void *, size_t, FSE_CTable *, U32, symbolEncodingType_e, unsigned int *, U32, const BYTE *, size_t, const S16 *, U32, U32, const FSE_CTable *, size_t, void *, size_t)"
                 );
  }
  return sVar1;
}

Assistant:

size_t
ZSTD_buildCTable(void* dst, size_t dstCapacity,
                FSE_CTable* nextCTable, U32 FSELog, symbolEncodingType_e type,
                unsigned* count, U32 max,
                const BYTE* codeTable, size_t nbSeq,
                const S16* defaultNorm, U32 defaultNormLog, U32 defaultMax,
                const FSE_CTable* prevCTable, size_t prevCTableSize,
                void* entropyWorkspace, size_t entropyWorkspaceSize)
{
    BYTE* op = (BYTE*)dst;
    const BYTE* const oend = op + dstCapacity;
    DEBUGLOG(6, "ZSTD_buildCTable (dstCapacity=%u)", (unsigned)dstCapacity);

    switch (type) {
    case set_rle:
        FORWARD_IF_ERROR(FSE_buildCTable_rle(nextCTable, (BYTE)max));
        RETURN_ERROR_IF(dstCapacity==0, dstSize_tooSmall);
        *op = codeTable[0];
        return 1;
    case set_repeat:
        memcpy(nextCTable, prevCTable, prevCTableSize);
        return 0;
    case set_basic:
        FORWARD_IF_ERROR(FSE_buildCTable_wksp(nextCTable, defaultNorm, defaultMax, defaultNormLog, entropyWorkspace, entropyWorkspaceSize));  /* note : could be pre-calculated */
        return 0;
    case set_compressed: {
        S16 norm[MaxSeq + 1];
        size_t nbSeq_1 = nbSeq;
        const U32 tableLog = FSE_optimalTableLog(FSELog, nbSeq, max);
        if (count[codeTable[nbSeq-1]] > 1) {
            count[codeTable[nbSeq-1]]--;
            nbSeq_1--;
        }
        assert(nbSeq_1 > 1);
        FORWARD_IF_ERROR(FSE_normalizeCount(norm, tableLog, count, nbSeq_1, max));
        {   size_t const NCountSize = FSE_writeNCount(op, oend - op, norm, max, tableLog);   /* overflow protected */
            FORWARD_IF_ERROR(NCountSize);
            FORWARD_IF_ERROR(FSE_buildCTable_wksp(nextCTable, norm, max, tableLog, entropyWorkspace, entropyWorkspaceSize));
            return NCountSize;
        }
    }
    default: assert(0); RETURN_ERROR(GENERIC);
    }
}